

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_decomposition.hpp
# Opt level: O1

void __thiscall
polar::
polar_decomposition<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (polar *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *A,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *U,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *H,double rtol,size_t max_iter)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  polar *ppVar6;
  unsigned_long __tmp_1;
  double *pdVar7;
  pointer pdVar8;
  double *pdVar9;
  size_type i2_1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  size_type sVar14;
  size_type sVar15;
  double *pdVar16;
  double *pdVar17;
  size_type i1;
  ulong uVar18;
  size_type i2;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  value_type gamma;
  undefined1 local_b8 [24];
  size_type local_a0;
  double *local_98;
  double local_90;
  polar *local_88;
  double local_80;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_78;
  double local_70;
  double local_68 [2];
  double *local_58;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_50;
  polar *local_48;
  polar *local_40;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_38;
  
  local_b8._0_8_ = *(undefined8 *)this;
  local_b8._8_8_ = *(undefined8 *)(this + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  local_88 = this;
  local_78 = H;
  local_70 = rtol;
  if (local_a0 == 0) {
    pdVar7 = (double *)0x0;
  }
  else {
    pdVar7 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  uVar1 = A->size1_;
  uVar2 = A->size2_;
  uVar11 = local_b8._0_8_;
  if (uVar1 < (ulong)local_b8._0_8_) {
    uVar11 = uVar1;
  }
  uVar13 = local_b8._8_8_;
  if (uVar2 < (ulong)local_b8._8_8_) {
    uVar13 = uVar2;
  }
  if (uVar11 != 0) {
    pdVar8 = (A->data_).data_;
    uVar18 = 0;
    pdVar9 = pdVar7;
    do {
      if (uVar13 != 0) {
        uVar19 = 0;
        do {
          pdVar9[uVar19] = pdVar8[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar13 != uVar19);
      }
      uVar18 = uVar18 + 1;
      pdVar9 = pdVar9 + local_b8._8_8_;
      pdVar8 = pdVar8 + uVar2;
    } while (uVar18 != uVar11);
  }
  local_98 = pdVar7;
  if ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)local_b8 != A) {
    A->size1_ = local_b8._0_8_;
    A->size2_ = local_b8._8_8_;
    sVar3 = (A->data_).size_;
    (A->data_).size_ = local_a0;
    local_98 = (A->data_).data_;
    (A->data_).data_ = pdVar7;
    local_b8._0_8_ = uVar1;
    local_b8._8_8_ = uVar2;
    local_a0 = sVar3;
  }
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  ppVar6 = local_88;
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            (A,local_88);
  local_b8._0_8_ = *(undefined8 *)ppVar6;
  local_b8._8_8_ = *(undefined8 *)(ppVar6 + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  if (local_a0 == 0) {
    pdVar7 = (double *)0x0;
  }
  else {
    pdVar7 = __gnu_cxx::new_allocator<double>::allocate
                       ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  uVar1 = U->size1_;
  uVar2 = U->size2_;
  uVar11 = local_b8._0_8_;
  if (uVar1 < (ulong)local_b8._0_8_) {
    uVar11 = uVar1;
  }
  uVar13 = local_b8._8_8_;
  if (uVar2 < (ulong)local_b8._8_8_) {
    uVar13 = uVar2;
  }
  if (uVar11 != 0) {
    pdVar8 = (U->data_).data_;
    uVar18 = 0;
    pdVar9 = pdVar7;
    do {
      if (uVar13 != 0) {
        uVar19 = 0;
        do {
          pdVar9[uVar19] = pdVar8[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar13 != uVar19);
      }
      uVar18 = uVar18 + 1;
      pdVar9 = pdVar9 + local_b8._8_8_;
      pdVar8 = pdVar8 + uVar2;
    } while (uVar18 != uVar11);
  }
  local_98 = pdVar7;
  if ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
       *)local_b8 != U) {
    U->size1_ = local_b8._0_8_;
    U->size2_ = local_b8._8_8_;
    sVar3 = (U->data_).size_;
    (U->data_).size_ = local_a0;
    local_98 = (U->data_).data_;
    (U->data_).data_ = pdVar7;
    local_b8._0_8_ = uVar1;
    local_b8._8_8_ = uVar2;
    local_a0 = sVar3;
  }
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  local_b8._0_8_ = *(undefined8 *)local_88;
  local_b8._8_8_ = *(undefined8 *)(local_88 + 8);
  local_a0 = local_b8._8_8_ * local_b8._0_8_;
  if (local_a0 == 0) {
    local_98 = (double *)0x0;
  }
  else {
    local_98 = __gnu_cxx::new_allocator<double>::allocate
                         ((new_allocator<double> *)(local_b8 + 0x10),local_a0,(void *)0x0);
  }
  bVar5 = false;
  pmVar10 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)0x0;
  do {
    if (local_b8._0_8_ != 0) {
      sVar12 = A->size2_;
      pdVar8 = (A->data_).data_;
      sVar14 = 0;
      pdVar7 = local_98;
      do {
        if (local_b8._8_8_ != 0) {
          sVar15 = 0;
          do {
            pdVar7[sVar15] = pdVar8[sVar15];
            sVar15 = sVar15 + 1;
          } while (local_b8._8_8_ != sVar15);
        }
        sVar14 = sVar14 + 1;
        pdVar8 = pdVar8 + sVar12;
        pdVar7 = pdVar7 + local_b8._8_8_;
      } while (sVar14 != local_b8._0_8_);
    }
    detail::
    invert<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)local_b8,U);
    local_90 = 1.0;
    if (!bVar5) {
      dVar21 = 0.0;
      dVar20 = 0.0;
      if (local_b8._8_8_ != 0) {
        sVar12 = 0;
        pdVar7 = local_98;
        dVar22 = 0.0;
        do {
          dVar20 = 0.0;
          pdVar9 = pdVar7;
          for (sVar14 = local_b8._0_8_; sVar14 != 0; sVar14 = sVar14 - 1) {
            dVar20 = dVar20 + ABS(*pdVar9);
            pdVar9 = pdVar9 + local_b8._8_8_;
          }
          if (dVar20 <= dVar22) {
            dVar20 = dVar22;
          }
          sVar12 = sVar12 + 1;
          pdVar7 = pdVar7 + 1;
          dVar22 = dVar20;
        } while (sVar12 != local_b8._8_8_);
      }
      if (local_b8._0_8_ != 0) {
        sVar12 = 0;
        pdVar7 = local_98;
        dVar22 = 0.0;
        do {
          dVar21 = 0.0;
          if (local_b8._8_8_ != 0) {
            sVar14 = 0;
            do {
              dVar21 = dVar21 + ABS(pdVar7[sVar14]);
              sVar14 = sVar14 + 1;
            } while (local_b8._8_8_ != sVar14);
          }
          if (dVar21 <= dVar22) {
            dVar21 = dVar22;
          }
          sVar12 = sVar12 + 1;
          pdVar7 = pdVar7 + local_b8._8_8_;
          dVar22 = dVar21;
        } while (sVar12 != local_b8._0_8_);
      }
      dVar20 = dVar20 * dVar21;
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      sVar12 = U->size2_;
      dVar22 = 0.0;
      dVar21 = 0.0;
      if (sVar12 != 0) {
        pdVar7 = (U->data_).data_;
        sVar14 = 0;
        dVar23 = 0.0;
        do {
          dVar21 = 0.0;
          pdVar9 = pdVar7;
          for (sVar15 = U->size1_; sVar15 != 0; sVar15 = sVar15 - 1) {
            dVar21 = dVar21 + ABS(*pdVar9);
            pdVar9 = pdVar9 + sVar12;
          }
          if (dVar21 <= dVar23) {
            dVar21 = dVar23;
          }
          sVar14 = sVar14 + 1;
          pdVar7 = pdVar7 + 1;
          dVar23 = dVar21;
        } while (sVar14 != sVar12);
      }
      if (U->size1_ != 0) {
        pdVar8 = (U->data_).data_;
        sVar14 = 0;
        dVar23 = 0.0;
        do {
          dVar22 = 0.0;
          if (sVar12 != 0) {
            sVar15 = 0;
            do {
              dVar22 = dVar22 + ABS(pdVar8[sVar15]);
              sVar15 = sVar15 + 1;
            } while (sVar12 != sVar15);
          }
          if (dVar22 <= dVar23) {
            dVar22 = dVar23;
          }
          sVar14 = sVar14 + 1;
          pdVar8 = pdVar8 + sVar12;
          dVar23 = dVar22;
        } while (sVar14 != U->size1_);
      }
      dVar21 = dVar21 * dVar22;
      if (dVar21 < 0.0) {
        local_80 = dVar20;
        dVar21 = sqrt(dVar21);
        dVar20 = local_80;
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      dVar21 = dVar21 / dVar20;
      if (dVar21 < 0.0) {
        local_90 = sqrt(dVar21);
      }
      else {
        local_90 = SQRT(dVar21);
      }
    }
    local_68[1] = 0.5;
    local_68[0] = 1.0 / local_90;
    local_58 = local_68 + 1;
    local_50 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)&local_90;
    local_40 = (polar *)local_68;
    local_48 = (polar *)local_b8;
    local_38 = U;
    boost::numeric::ublas::
    indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              (A,&local_58);
    dVar21 = 0.0;
    dVar20 = 0.0;
    if (local_b8._8_8_ != 0) {
      pdVar7 = (A->data_).data_;
      sVar12 = 0;
      pdVar9 = local_98;
      dVar22 = 0.0;
      do {
        dVar20 = 0.0;
        pdVar16 = pdVar9;
        pdVar17 = pdVar7;
        for (sVar14 = local_b8._0_8_; sVar14 != 0; sVar14 = sVar14 - 1) {
          dVar20 = dVar20 + ABS(*pdVar16 - *pdVar17);
          pdVar17 = pdVar17 + A->size2_;
          pdVar16 = pdVar16 + local_b8._8_8_;
        }
        if (dVar20 <= dVar22) {
          dVar20 = dVar22;
        }
        sVar12 = sVar12 + 1;
        pdVar7 = pdVar7 + 1;
        pdVar9 = pdVar9 + 1;
        dVar22 = dVar20;
      } while (sVar12 != local_b8._8_8_);
    }
    if (local_b8._8_8_ != 0) {
      sVar12 = 0;
      pdVar7 = local_98;
      dVar22 = 0.0;
      do {
        dVar21 = 0.0;
        pdVar9 = pdVar7;
        for (sVar14 = local_b8._0_8_; sVar14 != 0; sVar14 = sVar14 - 1) {
          dVar21 = dVar21 + ABS(*pdVar9);
          pdVar9 = pdVar9 + local_b8._8_8_;
        }
        if (dVar21 <= dVar22) {
          dVar21 = dVar22;
        }
        sVar12 = sVar12 + 1;
        pdVar7 = pdVar7 + 1;
        dVar22 = dVar21;
      } while (sVar12 != local_b8._8_8_);
    }
    if ((dVar20 < dVar21 * local_70) ||
       ((local_78 !=
         (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)0x0 &&
        (pmVar10 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)((long)&pmVar10->size1_ + 1), pmVar10 == local_78)))) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (!bVar5) {
        if (local_b8._0_8_ == 0) {
          dVar20 = 0.0;
        }
        else {
          pdVar8 = (A->data_).data_;
          dVar20 = 0.0;
          sVar12 = 0;
          pdVar7 = local_98;
          do {
            if (local_b8._8_8_ != 0) {
              sVar14 = 0;
              do {
                dVar20 = dVar20 + (pdVar7[sVar14] - pdVar8[sVar14]) *
                                  (pdVar7[sVar14] - pdVar8[sVar14]);
                sVar14 = sVar14 + 1;
              } while (local_b8._8_8_ != sVar14);
            }
            sVar12 = sVar12 + 1;
            pdVar8 = pdVar8 + A->size2_;
            pdVar7 = pdVar7 + local_b8._8_8_;
          } while (sVar12 != local_b8._0_8_);
        }
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        bVar5 = false;
        if (dVar20 < 0.01) {
          bVar5 = true;
        }
      }
    }
  } while (bVar4);
  local_90 = 0.5;
  local_58 = &local_90;
  local_48 = local_88;
  local_40 = local_88;
  local_50 = A;
  local_38 = A;
  boost::numeric::ublas::
  indexing_matrix_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<d___umeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
            (U);
  if (local_a0 != 0) {
    operator_delete(local_98,local_a0 << 3);
  }
  return;
}

Assistant:

void polar_decomposition(Matrix_in const& A, Matrix_out& U, Matrix_out& H,
        double rtol = 1.0e-8, std::size_t max_iter = 0)
{
    typedef typename Matrix_out::value_type value_type;

    BOOST_ASSERT(A.size1() == A.size2());

    U.resize(A.size1(), A.size2());
    U.assign(A);
    H.resize(A.size1(), A.size2());
    Matrix_out X(A.size1(), A.size2());

    std::size_t count = 0;
    bool close_to_convergence = false;

    while (true)
    {
        X.assign(U);
        detail::invert(X, H);
        value_type gamma = 1.0;

        if (!close_to_convergence)
        {
            value_type alpha = std::sqrt(norm_1(X) * norm_inf(X));
            value_type beta  = std::sqrt(norm_1(H) * norm_inf(H));
            gamma = std::sqrt(beta / alpha);
        }

        U.assign(0.5 * (gamma * X + 1.0 / gamma * trans(H)));

        if (norm_1(X - U) < rtol * norm_1(X))
            break;

        if (max_iter != 0 && ++count == max_iter)
            break;

        if (!close_to_convergence && norm_frobenius(X - U) < 1.0e-2)
            close_to_convergence = true;
    }

    H.assign(0.5 * (prod(trans(U), A) + prod(trans(A), U)));
}